

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL GetFileAttributesExW
               (LPCWSTR lpFileName,GET_FILEEX_INFO_LEVELS fInfoLevelId,LPVOID lpFileInformation)

{
  __syscall_slong_t *lpMultiByteStr;
  long lVar1;
  DWORD DVar2;
  PAL_ERROR PVar3;
  void *pvVar4;
  PAL_ERROR *pPVar5;
  size_t sVar6;
  FILETIME FVar7;
  int iVar8;
  BOOL BVar9;
  long in_FS_OFFSET;
  undefined1 local_108 [8];
  stat stat_data;
  PathCharString namePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lpMultiByteStr = stat_data.__glibc_reserved + 2;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002be225;
  pvVar4 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar4 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if (fInfoLevelId == GetFileExInfoStandard) {
    if (lpFileInformation == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x74a);
      PVar3 = 0x57;
      fprintf(_stderr,"lpFileInformation is NULL\n");
      goto LAB_002be08b;
    }
    if (lpFileName == (LPCWSTR)0x0) {
      PVar3 = 3;
      goto LAB_002be08b;
    }
    sVar6 = PAL_wcslen(lpFileName);
    iVar8 = ((int)sVar6 + 1) * MaxWCharToAcpLengthFactor;
    StackString<32UL,_char>::Resize
              ((StackString<32UL,_char> *)(stat_data.__glibc_reserved + 2),(long)iVar8);
    if (lpMultiByteStr == (__syscall_slong_t *)0x0) {
      PVar3 = 8;
      goto LAB_002be08b;
    }
    iVar8 = WideCharToMultiByte(0,0,lpFileName,-1,(LPSTR)lpMultiByteStr,iVar8,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    stat_data.__glibc_reserved[2]._0_1_ = 0;
    if (iVar8 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        PVar3 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002be225;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x76a);
        PVar3 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_002be08b;
    }
    DVar2 = GetFileAttributesW(lpFileName);
    *(DWORD *)lpFileInformation = DVar2;
    BVar9 = 0;
    if (DVar2 != 0xffffffff) {
      FILEDosToUnixPathA((LPSTR)lpMultiByteStr);
      iVar8 = stat64((char *)lpMultiByteStr,(stat64 *)local_108);
      if (iVar8 == 0) {
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_mtim.tv_nsec,0);
        *(FILETIME *)((long)lpFileInformation + 4) = FVar7;
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_blocks,0);
        *(FILETIME *)((long)lpFileInformation + 0xc) = FVar7;
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_atim.tv_nsec,0);
        *(FILETIME *)((long)lpFileInformation + 0x14) = FVar7;
        *(__dev_t *)((long)lpFileInformation + 0x1c) =
             stat_data.st_rdev >> 0x20 | stat_data.st_rdev << 0x20;
        BVar9 = 1;
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002be225;
        PVar3 = FILEGetLastErrorFromErrnoAndFilename((LPSTR)lpMultiByteStr);
        BVar9 = 0;
        if (PVar3 != 0) goto LAB_002be08b;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x743);
    PVar3 = 0x57;
    fprintf(_stderr,"Unrecognized value for fInfoLevelId=%d\n",(ulong)fInfoLevelId);
LAB_002be08b:
    pPVar5 = (PAL_ERROR *)__errno_location();
    *pPVar5 = PVar3;
    BVar9 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString
              ((StackString<32UL,_char> *)(stat_data.__glibc_reserved + 2));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return BVar9;
    }
    __stack_chk_fail();
  }
LAB_002be225:
  abort();
}

Assistant:

BOOL
PALAPI
GetFileAttributesExW(
             IN LPCWSTR lpFileName,
             IN GET_FILEEX_INFO_LEVELS fInfoLevelId,
             OUT LPVOID lpFileInformation)
{
    CPalThread *pThread;
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;
    LPWIN32_FILE_ATTRIBUTE_DATA attr_data;

    struct stat stat_data;

    char * name;
    PathCharString namePS;
    int length = 0;
    int  size;

    PERF_ENTRY(GetFileAttributesExW);
    ENTRY("GetFileAttributesExW(lpFileName=%p (%S), fInfoLevelId=%d, "
          "lpFileInformation=%p)\n", lpFileName?lpFileName:W16_NULLSTRING, lpFileName?lpFileName:W16_NULLSTRING,
          fInfoLevelId, lpFileInformation);

    pThread = InternalGetCurrentThread();
    if ( fInfoLevelId != GetFileExInfoStandard )
    {
        ASSERT("Unrecognized value for fInfoLevelId=%d\n", fInfoLevelId);
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( !lpFileInformation )
    {
        ASSERT("lpFileInformation is NULL\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if (lpFileName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    attr_data = (LPWIN32_FILE_ATTRIBUTE_DATA)lpFileInformation;

    attr_data->dwFileAttributes = GetFileAttributesW(lpFileName);
    /* assume that GetFileAttributes will call SetLastError appropriately */
    if ( attr_data->dwFileAttributes == (DWORD)-1 )
    {
        goto done;
    }

    FILEDosToUnixPathA(name);
    /* do the stat */
    if ( stat(name, &stat_data) != 0 )
    {
        ERROR("stat failed on %S\n", lpFileName);
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(name);
        goto done;
    }

    /* get the file times */
    attr_data->ftCreationTime =
        FILEUnixTimeToFileTime( stat_data.st_ctime,
                                ST_CTIME_NSEC(&stat_data) );
    attr_data->ftLastAccessTime =
        FILEUnixTimeToFileTime( stat_data.st_atime,
                                ST_ATIME_NSEC(&stat_data) );
    attr_data->ftLastWriteTime =
        FILEUnixTimeToFileTime( stat_data.st_mtime,
                                ST_MTIME_NSEC(&stat_data) );

    /* Get the file size. GetFileSize is not used because it gets the
       size of an already-open file */
    attr_data->nFileSizeLow = (DWORD) stat_data.st_size;
#if SIZEOF_OFF_T > 4
    attr_data->nFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
    attr_data->nFileSizeHigh = 0;
#endif

    bRet = TRUE;

done:
    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("GetFileAttributesExW returns BOOL %d\n", bRet);
    PERF_EXIT(GetFileAttributesExW);
    return bRet;
}